

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall glslang::HlslGrammar::acceptJumpStatement(HlslGrammar *this,TIntermNode **statement)

{
  bool bVar1;
  size_type sVar2;
  TIntermNode *pTVar3;
  TIntermBranch *pTVar4;
  TIntermTyped *local_30;
  TIntermTyped *node;
  TIntermNode **ppTStack_20;
  EHlslTokenClass jump;
  TIntermNode **statement_local;
  HlslGrammar *this_local;
  
  ppTStack_20 = statement;
  statement_local = (TIntermNode **)this;
  node._4_4_ = HlslTokenStream::peek(&this->super_HlslTokenStream);
  if ((node._4_4_ - EHTokBreak < 2) || (node._4_4_ == EHTokDiscard || node._4_4_ == EHTokReturn)) {
    HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
    switch(node._4_4_) {
    case EHTokBreak:
      pTVar4 = TIntermediate::addBranch
                         (this->intermediate,EOpBreak,&(this->super_HlslTokenStream).token.loc);
      *ppTStack_20 = &pTVar4->super_TIntermNode;
      if (((this->parseContext->super_TParseContextBase).loopNestingLevel == 0) &&
         (sVar2 = std::__cxx11::
                  list<glslang::TVector<TIntermNode_*>_*,_glslang::pool_allocator<glslang::TVector<TIntermNode_*>_*>_>
                  ::size(&(this->parseContext->super_TParseContextBase).switchSequenceStack.
                          super_list<glslang::TVector<TIntermNode_*>_*,_glslang::pool_allocator<glslang::TVector<TIntermNode_*>_*>_>
                        ), sVar2 == 0)) {
        expected(this,"loop or switch");
        return false;
      }
      break;
    case EHTokContinue:
      pTVar4 = TIntermediate::addBranch
                         (this->intermediate,EOpContinue,&(this->super_HlslTokenStream).token.loc);
      *ppTStack_20 = &pTVar4->super_TIntermNode;
      if ((this->parseContext->super_TParseContextBase).loopNestingLevel == 0) {
        expected(this,"loop");
        return false;
      }
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslGrammar.cpp"
                    ,0x106c,"bool glslang::HlslGrammar::acceptJumpStatement(TIntermNode *&)");
    case EHTokDiscard:
      pTVar4 = TIntermediate::addBranch
                         (this->intermediate,EOpKill,&(this->super_HlslTokenStream).token.loc);
      *ppTStack_20 = &pTVar4->super_TIntermNode;
      break;
    case EHTokReturn:
      bVar1 = acceptExpression(this,&local_30);
      if (bVar1) {
        pTVar3 = HlslParseContext::handleReturnValue
                           (this->parseContext,&(this->super_HlslTokenStream).token.loc,local_30);
        *ppTStack_20 = pTVar3;
      }
      else {
        pTVar4 = TIntermediate::addBranch
                           (this->intermediate,EOpReturn,&(this->super_HlslTokenStream).token.loc);
        *ppTStack_20 = &pTVar4->super_TIntermNode;
      }
    }
    bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokSemicolon);
    if (!bVar1) {
      expected(this,";");
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool HlslGrammar::acceptJumpStatement(TIntermNode*& statement)
{
    EHlslTokenClass jump = peek();
    switch (jump) {
    case EHTokContinue:
    case EHTokBreak:
    case EHTokDiscard:
    case EHTokReturn:
        advanceToken();
        break;
    default:
        // not something we handle in this function
        return false;
    }

    switch (jump) {
    case EHTokContinue:
        statement = intermediate.addBranch(EOpContinue, token.loc);
        if (parseContext.loopNestingLevel == 0) {
            expected("loop");
            return false;
        }
        break;
    case EHTokBreak:
        statement = intermediate.addBranch(EOpBreak, token.loc);
        if (parseContext.loopNestingLevel == 0 && parseContext.switchSequenceStack.size() == 0) {
            expected("loop or switch");
            return false;
        }
        break;
    case EHTokDiscard:
        statement = intermediate.addBranch(EOpKill, token.loc);
        break;

    case EHTokReturn:
    {
        // expression
        TIntermTyped* node;
        if (acceptExpression(node)) {
            // hook it up
            statement = parseContext.handleReturnValue(token.loc, node);
        } else
            statement = intermediate.addBranch(EOpReturn, token.loc);
        break;
    }

    default:
        assert(0);
        return false;
    }

    // SEMICOLON
    if (! acceptTokenClass(EHTokSemicolon))
        expected(";");

    return true;
}